

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O3

void __thiscall
KDIS::NETWORK::ConnectionAddressFilter::ConnectionAddressFilter
          (ConnectionAddressFilter *this,FilterMode FM)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ConnectionSubscriber)._vptr_ConnectionSubscriber =
       (_func_int **)&PTR__ConnectionAddressFilter_00322558;
  this->m_FM = FM;
  p_Var1 = &(this->m_Filter)._M_t._M_impl.super__Rb_tree_header;
  (this->m_Filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_Filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_Filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_Filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_Filter)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ConnectionAddressFilter::ConnectionAddressFilter( FilterMode FM /* = AllowAddressesInFilterList */ ) :
	m_FM( FM )
{
}